

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSplay.h
# Opt level: O3

HighsInt highs_splay<int,HighsGFkSolve::unlink(int)::__0&,HighsGFkSolve::unlink(int)::__1&,HighsGFkSolve::unlink(int)::__2&>
                   (int *key,HighsInt root,anon_class_8_1_8991fb9c *get_left,
                   anon_class_8_1_8991fb9c *get_right,anon_class_8_1_8991fb9c *get_key)

{
  int iVar1;
  HighsGFkSolve *pHVar2;
  HighsInt *pHVar3;
  int iVar4;
  long lVar5;
  HighsInt *pHVar6;
  HighsInt *pHVar7;
  HighsGFkSolve *pHVar8;
  HighsInt y;
  long lVar9;
  HighsGFkSolve *pHVar10;
  HighsInt local_20;
  HighsInt local_1c;
  HighsInt Nright;
  HighsInt Nleft;
  
  if (root == -1) {
    return -1;
  }
  pHVar6 = &local_1c;
  local_1c = -1;
  pHVar7 = &local_20;
  local_20 = -1;
  pHVar2 = get_key[4].this;
  do {
    iVar4 = *key;
    lVar5 = (long)root;
    if (iVar4 < (&pHVar2->numCol)[lVar5]) {
      pHVar10 = get_left[0x1c].this;
      iVar1 = (&pHVar10->numCol)[lVar5];
      lVar9 = (long)iVar1;
      if (lVar9 == -1) {
        pHVar8 = get_right[0x1f].this;
        iVar4 = -1;
        goto LAB_002a0d97;
      }
      if (iVar4 < (&pHVar2->numCol)[lVar9]) {
        pHVar8 = get_right[0x1f].this;
        (&pHVar10->numCol)[lVar5] = (&pHVar8->numCol)[lVar9];
        (&pHVar8->numCol)[lVar9] = root;
        lVar5 = lVar9;
        root = iVar1;
        if ((&pHVar10->numCol)[lVar9] == -1) goto LAB_002a0d79;
      }
      *pHVar6 = root;
      pHVar3 = &pHVar10->numCol + lVar5;
      pHVar6 = pHVar3;
    }
    else {
      pHVar8 = get_right[0x1f].this;
      if (iVar4 <= (&pHVar2->numCol)[lVar5]) {
LAB_002a0d79:
        pHVar10 = get_left[0x1c].this;
        iVar4 = (&pHVar10->numCol)[lVar5];
LAB_002a0d97:
        *pHVar7 = iVar4;
        *pHVar6 = (&pHVar8->numCol)[lVar5];
        (&pHVar10->numCol)[lVar5] = local_20;
        (&pHVar8->numCol)[lVar5] = local_1c;
        return root;
      }
      iVar1 = (&pHVar8->numCol)[lVar5];
      lVar9 = (long)iVar1;
      if (lVar9 == -1) goto LAB_002a0d79;
      if ((&pHVar2->numCol)[lVar9] < iVar4) {
        pHVar10 = get_left[0x1c].this;
        (&pHVar8->numCol)[lVar5] = (&pHVar10->numCol)[lVar9];
        (&pHVar10->numCol)[lVar9] = root;
        lVar5 = lVar9;
        root = iVar1;
        if ((&pHVar8->numCol)[lVar9] == -1) goto LAB_002a0d79;
      }
      *pHVar7 = root;
      pHVar3 = &pHVar8->numCol + lVar5;
      pHVar7 = pHVar3;
    }
    root = *pHVar3;
  } while( true );
}

Assistant:

HighsInt highs_splay(const KeyT& key, HighsInt root, GetLeft&& get_left,
                     GetRight&& get_right, GetKey&& get_key) {
  if (root == -1) return -1;

  HighsInt Nleft = -1;
  HighsInt Nright = -1;
  HighsInt* lright = &Nright;
  HighsInt* rleft = &Nleft;

  while (true) {
    if (key < get_key(root)) {
      HighsInt left = get_left(root);
      if (left == -1) break;
      if (key < get_key(left)) {
        HighsInt y = left;
        get_left(root) = get_right(y);
        get_right(y) = root;
        root = y;
        if (get_left(root) == -1) break;
      }

      *rleft = root;
      rleft = &get_left(root);
      root = get_left(root);
    } else if (key > get_key(root)) {
      HighsInt right = get_right(root);
      if (right == -1) break;
      if (key > get_key(right)) {
        HighsInt y = right;
        get_right(root) = get_left(y);
        get_left(y) = root;
        root = y;
        if (get_right(root) == -1) break;
      }

      *lright = root;
      lright = &get_right(root);
      root = get_right(root);
    } else
      break;
  }

  *lright = get_left(root);
  *rleft = get_right(root);
  get_left(root) = Nright;
  get_right(root) = Nleft;

  return root;
}